

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextInput.cpp
# Opt level: O2

bool removeUtf8Char(string *value,size_t position)

{
  ulong uVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  start;
  size_t sVar2;
  iterator it;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  uVar1 = value->_M_string_length;
  if (position < uVar1) {
    sVar2 = f8n::utf::u8offset(value,(int)position + -1);
    if (sVar2 == 0xffffffffffffffff) {
      return false;
    }
    f8n::utf::u8offset(value,(int)position);
    std::__cxx11::string::erase((ulong)value,sVar2);
  }
  else {
    start._M_current = (value->_M_dataplus)._M_p;
    local_40._M_current = start._M_current + uVar1;
    if (uVar1 == 0) {
      return false;
    }
    utf8::prior<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(&local_40,start);
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)local_38,(value->_M_dataplus)._M_p,local_40._M_current);
    std::__cxx11::string::operator=((string *)value,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return true;
}

Assistant:

inline static bool removeUtf8Char(std::string& value, size_t position) {
    /* optimize the normal case, at the end... */
    if (position >= value.size()) {
        std::string::iterator it = value.end();
        const std::string::iterator start = value.begin();
        if (it != start) {
            utf8::prior(it, start);
            value = std::string(value.begin(), it);
            return true;
        }
    }
    else {
        const size_t offset = u8offset(value, position - 1);
        if (offset != std::string::npos) {
            const size_t end = u8offset(value, position);
            value.erase(offset, end - offset);
            return true;
        }
    }

    return false;
}